

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_compress.c
# Opt level: O3

size_t libdeflate_zlib_compress
                 (libdeflate_compressor *c,void *in,size_t in_nbytes,void *out,
                 size_t out_nbytes_avail)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  size_t sVar4;
  uint uVar5;
  
  if (6 < out_nbytes_avail) {
    uVar2 = libdeflate_get_compression_level(c);
    uVar5 = 0x7800;
    if ((1 < uVar2) && (uVar5 = 0x7840, 5 < uVar2)) {
      uVar5 = (uint)(7 < uVar2) << 6 | 0x7880;
    }
    uVar1 = ((short)(uVar5 / 0x1f) - (short)(uVar5 / 0x1f << 5)) + (ushort)uVar5 | (ushort)uVar5;
    *(ushort *)out = (uVar1 ^ 0x1f) << 8 | uVar1 >> 8;
    sVar4 = libdeflate_deflate_compress(c,in,in_nbytes,(void *)((long)out + 2),out_nbytes_avail - 6)
    ;
    if (sVar4 != 0) {
      uVar3 = libdeflate_adler32(1,in,in_nbytes);
      *(uint32_t *)((long)out + sVar4 + 2) =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      return (long)out + 2 + (sVar4 - (long)out) + 4;
    }
  }
  return 0;
}

Assistant:

LIBDEFLATEAPI size_t
libdeflate_zlib_compress(struct libdeflate_compressor *c,
			 const void *in, size_t in_nbytes,
			 void *out, size_t out_nbytes_avail)
{
	u8 *out_next = out;
	u16 hdr;
	unsigned compression_level;
	unsigned level_hint;
	size_t deflate_size;

	if (out_nbytes_avail <= ZLIB_MIN_OVERHEAD)
		return 0;

	/* 2 byte header: CMF and FLG  */
	hdr = (ZLIB_CM_DEFLATE << 8) | (ZLIB_CINFO_32K_WINDOW << 12);
	compression_level = libdeflate_get_compression_level(c);
	if (compression_level < 2)
		level_hint = ZLIB_FASTEST_COMPRESSION;
	else if (compression_level < 6)
		level_hint = ZLIB_FAST_COMPRESSION;
	else if (compression_level < 8)
		level_hint = ZLIB_DEFAULT_COMPRESSION;
	else
		level_hint = ZLIB_SLOWEST_COMPRESSION;
	hdr |= level_hint << 6;
	hdr |= 31 - (hdr % 31);

	put_unaligned_be16(hdr, out_next);
	out_next += 2;

	/* Compressed data  */
	deflate_size = libdeflate_deflate_compress(c, in, in_nbytes, out_next,
					out_nbytes_avail - ZLIB_MIN_OVERHEAD);
	if (deflate_size == 0)
		return 0;
	out_next += deflate_size;

	/* ADLER32  */
	put_unaligned_be32(libdeflate_adler32(1, in, in_nbytes), out_next);
	out_next += 4;

	return out_next - (u8 *)out;
}